

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  int offset_;
  GLValue max_;
  bool bVar1;
  int iVar2;
  int iVar3;
  MultiVertexArrayTest *this_00;
  InputType type;
  long lVar4;
  bool bVar5;
  GLValue GVar6;
  string name;
  Spec spec;
  ArraySpec arraySpec;
  long local_100;
  long local_f8;
  long local_e8;
  string local_d8;
  undefined1 local_b8 [16];
  pointer local_a8;
  pointer pAStack_a0;
  pointer local_98;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  local_100 = 0;
  do {
    local_f8 = 0;
    do {
      local_e8 = 0;
      bVar5 = true;
      do {
        bVar1 = bVar5;
        lVar4 = 0;
        do {
          if (lVar4 == 0) {
            type = *(InputType *)(&DAT_01be5a70 + local_100 * 4);
            iVar2 = deqp::gls::Array::inputTypeSize(type);
            iVar2 = iVar2 * 2;
          }
          else {
            iVar2 = *(int *)((long)&DAT_01be5a7c + lVar4);
            type = *(InputType *)(&DAT_01be5a70 + local_100 * 4);
          }
          iVar3 = deqp::gls::Array::inputTypeSize(type);
          offset_ = *(int *)(&DAT_01bc2740 + local_f8 * 4);
          if (iVar2 % iVar3 == 0) {
            iVar3 = deqp::gls::Array::inputTypeSize(type);
            bVar5 = offset_ % iVar3 == 0;
          }
          else {
            bVar5 = false;
          }
          GVar6 = deqp::gls::GLValue::getMinValue(type);
          aStack_78 = GVar6.field_1;
          local_80 = GVar6.type;
          GVar6 = deqp::gls::GLValue::getMaxValue(type);
          aStack_88 = GVar6.field_1;
          local_90 = GVar6.type;
          max_._4_4_ = uStack_8c;
          max_.type = local_90;
          GVar6._4_4_ = uStack_7c;
          GVar6.type = local_80;
          GVar6.field_1 = aStack_78;
          max_.field_1 = aStack_88;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&local_70,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,2,offset_,
                     iVar2,false,GVar6,max_);
          local_a8 = (pointer)0x0;
          pAStack_a0 = (pointer)0x0;
          local_98 = (pointer)0x0;
          local_b8._0_4_ = PRIMITIVE_TRIANGLES;
          local_b8._4_4_ = (&DAT_01bc2920)[local_e8];
          local_b8._8_4_ = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_a8,(iterator)0x0,&local_70);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_d8,(Spec *)local_b8);
          if (!bVar5) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                               m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                       (Spec *)local_b8,local_d8._M_dataplus._M_p,local_d8._M_dataplus._M_p);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (local_a8 != (pointer)0x0) {
            operator_delete(local_a8,(long)local_98 - (long)local_a8);
          }
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0xc);
        local_e8 = 1;
        bVar5 = false;
      } while (bVar1);
      local_f8 = local_f8 + 1;
    } while (local_f8 != 4);
    local_100 = local_100 + 1;
  } while (local_100 != 3);
  return 0;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_FIXED};
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					const int	stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
					const bool	aligned	= ((stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0) && ((offsets[offsetNdx] % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0);

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	Array::USAGE_DYNAMIC_DRAW,
																	2,
																	offsets[offsetNdx],
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();
					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}